

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_selist.c
# Opt level: O2

void test_find_cb(CuTest *tc)

{
  _Bool _Var1;
  int a;
  int i;
  int c;
  int b;
  selist *il;
  selist *ql;
  
  a = 0x2a;
  b = 0x17;
  ql = (selist *)0x0;
  c = a;
  selist_push(&ql,&a);
  selist_push(&ql,&b);
  selist_push(&ql,&c);
  il = ql;
  i = 0;
  _Var1 = selist_find(&il,&i,&a,cb_match_int);
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_selist.c"
                ,0x4c,"assert failed",(uint)_Var1);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_selist.c",
             0x4d,(char *)0x0,0,i);
  selist_advance(&il,&i,1);
  _Var1 = selist_find(&il,&i,&a,cb_match_int);
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_selist.c"
                ,0x50,"assert failed",(uint)_Var1);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_selist.c",
             0x51,(char *)0x0,2,i);
  selist_advance(&il,&i,1);
  _Var1 = selist_find(&il,&i,&a,cb_match_int);
  CuAssert_Line(tc,
                "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_selist.c"
                ,0x54,"assert failed",(uint)!_Var1);
  selist_free(ql);
  return;
}

Assistant:

static void test_find_cb(CuTest *tc) {
    int a = 42;
    int b = 23;
    int c = 42;
    struct selist *ql = NULL;
    struct selist *il;
    int i;

    selist_push(&ql, (void *)&a);
    selist_push(&ql, (void *)&b);
    selist_push(&ql, (void *)&c);

    il = ql; i = 0;
    CuAssertTrue(tc, selist_find(&il, &i, (void *)&a, cb_match_int));
    CuAssertIntEquals(tc, 0, i);

    selist_advance(&il, &i, 1);
    CuAssertTrue(tc, selist_find(&il, &i, (void *)&a, cb_match_int));
    CuAssertIntEquals(tc, 2, i);

    selist_advance(&il, &i, 1);
    CuAssertTrue(tc, !selist_find(&il, &i, (void *)&a, cb_match_int));
    selist_free(ql);
}